

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  CacheEntryType CVar5;
  int iVar6;
  pointer pbVar7;
  long lVar8;
  char *__s;
  ostream *poVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  string *psVar13;
  size_type sVar14;
  undefined8 uVar15;
  bool bVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  string entryPattern;
  CacheEntryType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string arg;
  string path;
  undefined1 local_198 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  CacheEntryType local_154;
  undefined1 local_150 [17];
  undefined7 uStack_13f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  long *local_128;
  long local_120;
  long local_118 [2];
  string *local_108;
  undefined1 local_100 [184];
  char *local_48;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar3 = true;
  bVar16 = 0x20 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7);
  if (bVar16) {
    bVar2 = 0;
    uVar12 = 1;
    local_130 = args;
    do {
      local_128 = local_118;
      pcVar1 = pbVar7[uVar12]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar1,pcVar1 + pbVar7[uVar12]._M_string_length);
      lVar8 = std::__cxx11::string::find((char *)&local_128,0x4c9d47,0);
      uVar11 = (uint)uVar12;
      if (lVar8 == 0) {
        std::__cxx11::string::substr((ulong)local_100,(ulong)&local_128);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          uVar11 = uVar11 + 1;
          if ((ulong)uVar11 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_002bc9df;
          }
          bVar3 = false;
          cmSystemTools::Error
                    ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_002bc9df:
          local_178._M_allocated_capacity = (size_type)&local_168;
          local_178._8_8_ = 0;
          local_168._M_local_buf[0] = '\0';
          local_198._0_8_ = local_198 + 0x10;
          local_198._8_8_ = (string *)0x0;
          local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
          local_154 = UNINITIALIZED;
          bVar3 = cmCacheManager::ParseEntry
                            ((string *)local_100,(string *)&local_178,(string *)local_198,&local_154
                            );
          if (bVar3) {
            local_150._0_8_ = local_150 + 0x10;
            local_150._8_8_ = (string *)0x0;
            local_150[0x10] = 0;
            if (this->WarnUnusedCli == true) {
              __s = cmState::GetInitializedCacheValue(this->State,(string *)&local_178);
              bVar4 = __s != (char *)0x0;
              if (bVar4) {
                local_108 = (string *)local_150._8_8_;
                strlen(__s);
                bVar4 = true;
                std::__cxx11::string::_M_replace((ulong)local_150,0,(char *)local_108,(ulong)__s);
              }
            }
            else {
              bVar4 = false;
            }
            cmState::AddCacheEntry
                      (this->State,(string *)&local_178,(char *)local_198._0_8_,
                       "No help, variable specified on the command line.",local_154);
            if (this->WarnUnusedCli == true) {
              if (bVar4) {
                cmState::GetInitializedCacheValue(this->State,(string *)&local_178);
                iVar6 = std::__cxx11::string::compare(local_150);
                if (iVar6 == 0) goto LAB_002bccb9;
              }
              WatchUnusedCli(this,(string *)&local_178);
            }
LAB_002bccb9:
            if ((string *)local_150._0_8_ != (string *)(local_150 + 0x10)) {
              operator_delete((void *)local_150._0_8_,CONCAT71(uStack_13f,local_150[0x10]) + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Parse error in command line argument: ",0x26);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_128,local_120);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"Should be: VAR:type=value\n",0x1a);
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          if ((string *)local_198._0_8_ != (string *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_allocated_capacity != &local_168) {
            operator_delete((void *)local_178._M_allocated_capacity,
                            CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]
                                    ) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_100 + 0x10)) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        args = local_130;
        if (bVar3 != false) goto LAB_002bcfc3;
        bVar3 = false;
      }
      else {
        lVar8 = std::__cxx11::string::find((char *)&local_128,0x4a645e,0);
        if (lVar8 == 0) {
          this->SuppressDevWarnings = true;
          this->DoSuppressDevWarnings = true;
        }
        else {
          lVar8 = std::__cxx11::string::find((char *)&local_128,0x4a6484,0);
          if (lVar8 != 0) {
            lVar8 = std::__cxx11::string::find((char *)&local_128,0x4b6246,0);
            if (lVar8 == 0) {
              std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_128);
              if (local_178._8_8_ == 0) {
                uVar11 = uVar11 + 1;
                if ((ulong)uVar11 <
                    (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                  std::__cxx11::string::_M_assign((string *)local_178._M_local_buf);
                  goto LAB_002bcb90;
                }
                bVar3 = false;
                cmSystemTools::Error
                          ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
              }
              else {
LAB_002bcb90:
                cmsys::Glob::PatternToRegex((string *)local_198,(string *)&local_178,true,true);
                local_48 = (char *)0x0;
                if ((string *)local_198._0_8_ != (string *)0x0) {
                  cmsys::RegularExpression::compile
                            ((RegularExpression *)local_100,(char *)local_198._0_8_);
                }
                if ((string *)local_198._0_8_ != (string *)(local_198 + 0x10)) {
                  operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                }
                local_198._0_8_ = (string *)0x0;
                local_198._8_8_ = (string *)0x0;
                local_198._16_8_ = 0;
                cmState::GetCacheEntryKeys_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_150,this->State);
                for (psVar13 = (string *)local_150._0_8_; args = local_130,
                    psVar13 != (string *)local_150._8_8_; psVar13 = psVar13 + 1) {
                  CVar5 = cmState::GetCacheEntryType(this->State,psVar13);
                  if ((CVar5 != STATIC) &&
                     (bVar3 = cmsys::RegularExpression::find
                                        ((RegularExpression *)local_100,(psVar13->_M_dataplus)._M_p)
                     , bVar3)) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_198,psVar13);
                  }
                }
                psVar13 = (string *)local_198._0_8_;
                if (local_198._0_8_ != local_198._8_8_) {
                  do {
                    cmState::RemoveCacheEntry(this->State,psVar13);
                    psVar13 = psVar13 + 1;
                  } while (psVar13 != (string *)local_198._8_8_);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_150);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_198);
                if (local_48 != (char *)0x0) {
                  operator_delete__(local_48);
                }
                bVar3 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_allocated_capacity != &local_168) {
                sVar14 = CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]);
                uVar15 = local_178._M_allocated_capacity;
LAB_002bceb7:
                operator_delete((void *)uVar15,sVar14 + 1);
              }
LAB_002bcebf:
              if (bVar3) goto LAB_002bcfc3;
LAB_002bcec8:
              bVar3 = false;
            }
            else {
              lVar8 = std::__cxx11::string::find((char *)&local_128,0x4ab781,0);
              if (lVar8 == 0) {
                std::__cxx11::string::substr((ulong)local_100,(ulong)&local_128);
                if ((char *)local_100._8_8_ == (char *)0x0) {
                  uVar11 = uVar11 + 1;
                  if ((ulong)uVar11 <
                      (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                    std::__cxx11::string::_M_assign((string *)local_100);
                    goto LAB_002bce3c;
                  }
                  bVar3 = false;
                  cmSystemTools::Error
                            ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,
                             (char *)0x0);
                }
                else {
LAB_002bce3c:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"loading initial cache file ",0x1b);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,(char *)local_100._0_8_,local_100._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  bVar3 = true;
                  ReadListFile(this,args,(char *)local_100._0_8_);
                }
                sVar14 = local_100._16_8_;
                uVar15 = local_100._0_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_100 + 0x10)) goto LAB_002bceb7;
                goto LAB_002bcebf;
              }
              lVar8 = std::__cxx11::string::find((char *)&local_128,0x4a6147,0);
              if (lVar8 != 0) {
                lVar8 = std::__cxx11::string::find((char *)&local_128,0x4a614a,0);
                if (lVar8 == 0) {
                  bVar2 = 1;
                }
                goto LAB_002bcfc3;
              }
              uVar11 = uVar11 + 1;
              uVar12 = (ulong)uVar11;
              pbVar7 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (uVar12 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7
                                  >> 5)) {
                local_100._0_8_ = local_100 + 0x10;
                pcVar1 = pbVar7[uVar12]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_100,pcVar1,pcVar1 + pbVar7[uVar12]._M_string_length);
                uVar15 = local_100._8_8_;
                if ((char *)local_100._8_8_ == (char *)0x0) {
                  cmSystemTools::Error
                            ("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
                }
                else {
                  ReadListFile(this,args,(char *)local_100._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_100 + 0x10)) {
                  operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
                }
                if ((char *)uVar15 != (char *)0x0) goto LAB_002bcfc3;
                goto LAB_002bcec8;
              }
              bVar3 = false;
              cmSystemTools::Error
                        ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            goto LAB_002bcfc6;
          }
          this->SuppressDevWarnings = false;
          this->DoSuppressDevWarnings = true;
        }
LAB_002bcfc3:
        bVar3 = true;
      }
LAB_002bcfc6:
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
      if (!bVar3) break;
      uVar12 = (ulong)(uVar11 + 1);
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
      bVar16 = uVar12 < uVar10;
    } while (uVar12 < uVar10);
    bVar3 = (bool)(bVar2 ^ 1);
  }
  bVar4 = (bool)(bVar16 ^ 1);
  if ((bVar16 == false) && (!bVar3)) {
    bVar4 = FindPackage(this,args);
  }
  return bVar4;
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmCacheManager::ParseEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->State->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(arg.find("-Wno-dev",0) == 0)
      {
      this->SuppressDevWarnings = true;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-Wdev",0) == 0)
      {
      this->SuppressDevWarnings = false;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}